

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cert_app.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s1;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  char *pcVar10;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  mbedtls_entropy_context *crt;
  mbedtls_net_context server_fd;
  uint32_t flags;
  mbedtls_ssl_config conf;
  mbedtls_ssl_context ssl;
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_x509_crt cacert;
  mbedtls_x509_crl cacrl;
  mbedtls_entropy_context entropy;
  uchar buf [1024];
  char vrfy_buf [512];
  mbedtls_net_context local_1298;
  uint32_t local_1294;
  mbedtls_ssl_config local_1290;
  mbedtls_ssl_context local_1118;
  mbedtls_ctr_drbg_context local_f60;
  mbedtls_x509_crt local_e08;
  mbedtls_x509_crl local_be0;
  mbedtls_entropy_context local_a40;
  char local_638 [1024];
  char local_238 [520];
  
  mbedtls_net_init(&local_1298);
  mbedtls_ctr_drbg_init(&local_f60);
  mbedtls_ssl_init(&local_1118);
  mbedtls_ssl_config_init(&local_1290);
  mbedtls_x509_crt_init(&local_e08);
  mbedtls_x509_crl_init(&local_be0);
  if (argc == 0) {
LAB_00110885:
    printf(
          "\n usage: cert_app param=<>...\n\n acceptable parameters:\n    mode=file|ssl       default: none\n    filename=%%s         default: cert.crt\n    ca_file=%%s          The single file containing the top-level CA(s) you fully trust\n                        default: \"\" (none)\n    crl_file=%%s         The single CRL file you want to use\n                        default: \"\" (none)\n    ca_path=%%s          The path containing the top-level CA(s) you fully trust\n                        default: \"\" (none) (overrides ca_file)\n    server_name=%%s      default: localhost\n    server_port=%%d      default: 4433\n    debug_level=%%d      default: 0 (disabled)\n    permissive=%%d       default: 0 (disabled)\n\n"
          );
    uVar8 = 2;
    goto LAB_00110898;
  }
  opt.mode = 0;
  opt.filename = "cert.crt";
  opt.ca_file = anon_var_dwarf_2d326 + 9;
  opt.crl_file = anon_var_dwarf_2d326 + 9;
  opt.ca_path = anon_var_dwarf_2d326 + 9;
  opt.server_name = "localhost";
  opt.server_port = "4433";
  opt.debug_level = 0;
  opt.permissive = 0;
  if (1 < argc) {
    uVar13 = 1;
    do {
      pcVar12 = argv[uVar13];
      pcVar10 = strchr(pcVar12,0x3d);
      if (pcVar10 == (char *)0x0) goto LAB_00110885;
      __s1 = pcVar10 + 1;
      *pcVar10 = '\0';
      if (pcVar12 < __s1) {
        pcVar11 = (char *)0x0;
        do {
          bVar1 = argv[uVar13][(long)pcVar11];
          if ((byte)(bVar1 + 0xbf) < 0x1a) {
            argv[uVar13][(long)pcVar11] = bVar1 | 0x20;
          }
          pcVar11 = pcVar11 + 1;
        } while (pcVar10 + (1 - (long)pcVar12) != pcVar11);
      }
      iVar7 = strcmp(pcVar12,"mode");
      if (iVar7 == 0) {
        iVar7 = strcmp(__s1,"file");
        if (iVar7 == 0) {
          opt.mode = 1;
          pcVar10 = opt.filename;
          pcVar11 = opt.ca_file;
          pcVar3 = opt.crl_file;
          pcVar4 = opt.ca_path;
          pcVar5 = opt.server_name;
          pcVar6 = opt.server_port;
        }
        else {
          iVar7 = strcmp(__s1,"ssl");
          if (iVar7 != 0) goto LAB_00110885;
          opt.mode = 2;
          pcVar10 = opt.filename;
          pcVar11 = opt.ca_file;
          pcVar3 = opt.crl_file;
          pcVar4 = opt.ca_path;
          pcVar5 = opt.server_name;
          pcVar6 = opt.server_port;
        }
      }
      else {
        iVar7 = strcmp(pcVar12,"filename");
        pcVar10 = __s1;
        pcVar11 = opt.ca_file;
        pcVar3 = opt.crl_file;
        pcVar4 = opt.ca_path;
        pcVar5 = opt.server_name;
        pcVar6 = opt.server_port;
        if (((((iVar7 != 0) &&
              (iVar7 = strcmp(pcVar12,"ca_file"), pcVar10 = opt.filename, pcVar11 = __s1,
              pcVar3 = opt.crl_file, pcVar4 = opt.ca_path, pcVar5 = opt.server_name,
              pcVar6 = opt.server_port, iVar7 != 0)) &&
             (iVar7 = strcmp(pcVar12,"crl_file"), pcVar10 = opt.filename, pcVar11 = opt.ca_file,
             pcVar3 = __s1, pcVar4 = opt.ca_path, pcVar5 = opt.server_name, pcVar6 = opt.server_port
             , iVar7 != 0)) &&
            ((iVar7 = strcmp(pcVar12,"ca_path"), pcVar10 = opt.filename, pcVar11 = opt.ca_file,
             pcVar3 = opt.crl_file, pcVar4 = __s1, pcVar5 = opt.server_name,
             pcVar6 = opt.server_port, iVar7 != 0 &&
             (iVar7 = strcmp(pcVar12,"server_name"), pcVar10 = opt.filename, pcVar11 = opt.ca_file,
             pcVar3 = opt.crl_file, pcVar4 = opt.ca_path, pcVar5 = __s1, pcVar6 = opt.server_port,
             iVar7 != 0)))) &&
           (iVar7 = strcmp(pcVar12,"server_port"), pcVar10 = opt.filename, pcVar11 = opt.ca_file,
           pcVar3 = opt.crl_file, pcVar4 = opt.ca_path, pcVar5 = opt.server_name, pcVar6 = __s1,
           iVar7 != 0)) {
          iVar7 = strcmp(pcVar12,"debug_level");
          if (iVar7 == 0) {
            uVar8 = atoi(__s1);
            opt.debug_level = uVar8;
            pcVar10 = opt.filename;
            pcVar11 = opt.ca_file;
            pcVar3 = opt.crl_file;
            pcVar4 = opt.ca_path;
            pcVar5 = opt.server_name;
            pcVar6 = opt.server_port;
            if (0xffff < uVar8) goto LAB_00110885;
          }
          else {
            iVar7 = strcmp(pcVar12,"permissive");
            if (iVar7 != 0) goto LAB_00110885;
            uVar8 = atoi(__s1);
            opt.permissive = uVar8;
            pcVar10 = opt.filename;
            pcVar11 = opt.ca_file;
            pcVar3 = opt.crl_file;
            pcVar4 = opt.ca_path;
            pcVar5 = opt.server_name;
            pcVar6 = opt.server_port;
            if (1 < uVar8) goto LAB_00110885;
          }
        }
      }
      opt.server_port = pcVar6;
      opt.server_name = pcVar5;
      opt.ca_path = pcVar4;
      opt.crl_file = pcVar3;
      opt.ca_file = pcVar11;
      opt.filename = pcVar10;
      uVar13 = uVar13 + 1;
    } while (uVar13 != (uint)argc);
  }
  uVar8 = 0;
  printf("  . Loading the CA root certificate ...");
  fflush(_stdout);
  if (*opt.ca_path != '\0') {
    uVar8 = mbedtls_x509_crt_parse_path(&local_e08,opt.ca_path);
LAB_001107b0:
    bVar2 = true;
    if (-1 < (int)uVar8) goto LAB_001107bb;
    uVar13 = (ulong)-uVar8;
    pcVar12 = " failed\n  !  mbedtls_x509_crt_parse returned -0x%x\n\n";
LAB_00110802:
    printf(pcVar12,uVar13);
    goto LAB_00110898;
  }
  bVar2 = false;
  if (*opt.ca_file != '\0') {
    uVar8 = mbedtls_x509_crt_parse_file(&local_e08,opt.ca_file);
    goto LAB_001107b0;
  }
LAB_001107bb:
  printf(" ok (%d skipped)\n",(ulong)uVar8);
  if (*opt.crl_file != '\0') {
    uVar8 = mbedtls_x509_crl_parse_file(&local_be0,opt.crl_file);
    if (uVar8 != 0) {
      uVar13 = (ulong)-uVar8;
      pcVar12 = " failed\n  !  mbedtls_x509_crl_parse returned -0x%x\n\n";
      goto LAB_00110802;
    }
    bVar2 = true;
  }
  if (opt.mode == 2) {
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    mbedtls_entropy_init(&local_a40);
    uVar8 = mbedtls_ctr_drbg_seed(&local_f60,mbedtls_entropy_func,&local_a40,(uchar *)"cert_app",8);
    if (uVar8 == 0) {
      puts(" ok");
      printf("  . SSL connection to tcp/%s/%s...",opt.server_name,opt.server_port);
      fflush(_stdout);
      uVar8 = mbedtls_net_connect(&local_1298,opt.server_name,opt.server_port,0);
      if (uVar8 == 0) {
        uVar8 = mbedtls_ssl_config_defaults(&local_1290,0,0,0);
        if (uVar8 != 0) {
          pcVar12 = " failed\n  ! mbedtls_ssl_config_defaults returned %d\n\n";
          uVar13 = (ulong)uVar8;
          goto LAB_00110802;
        }
        if (bVar2) {
          mbedtls_ssl_conf_authmode(&local_1290,2);
          mbedtls_ssl_conf_ca_chain(&local_1290,&local_e08,(mbedtls_x509_crl *)0x0);
          mbedtls_ssl_conf_verify(&local_1290,my_verify,(void *)0x0);
        }
        else {
          mbedtls_ssl_conf_authmode(&local_1290,0);
        }
        mbedtls_ssl_conf_rng(&local_1290,mbedtls_ctr_drbg_random,&local_f60);
        mbedtls_ssl_conf_dbg(&local_1290,my_debug,_stdout);
        uVar8 = mbedtls_ssl_setup(&local_1118,&local_1290);
        if (uVar8 == 0) {
          uVar8 = mbedtls_ssl_set_hostname(&local_1118,opt.server_name);
          if (uVar8 == 0) {
            mbedtls_ssl_set_bio(&local_1118,&local_1298,mbedtls_net_send,mbedtls_net_recv,
                                (mbedtls_ssl_recv_timeout_t *)0x0);
            do {
              uVar8 = mbedtls_ssl_handshake(&local_1118);
              if (uVar8 == 0) {
                puts(" ok");
                puts("  . Peer certificate information    ...");
                uVar8 = mbedtls_x509_crt_info
                                  (local_638,0x3ff,"      ",(local_1118.session)->peer_cert);
                if (uVar8 == 0xffffffff) {
                  pcVar12 = " failed\n  !  mbedtls_x509_crt_info returned %d\n\n";
                  uVar8 = 0xffffffff;
                  uVar13 = 0xffffffff;
                  goto LAB_001109ca;
                }
                puts(local_638);
                mbedtls_ssl_close_notify(&local_1118);
                goto LAB_001109d1;
              }
              uVar13 = (ulong)uVar8;
            } while ((uVar8 & 0xffffff7f) == 0xffff9700);
            pcVar12 = " failed\n  ! mbedtls_ssl_handshake returned %d\n\n";
          }
          else {
            uVar13 = (ulong)uVar8;
            pcVar12 = " failed\n  ! mbedtls_ssl_set_hostname returned %d\n\n";
          }
        }
        else {
          uVar13 = (ulong)uVar8;
          pcVar12 = " failed\n  ! mbedtls_ssl_setup returned %d\n\n";
        }
      }
      else {
        uVar13 = (ulong)uVar8;
        pcVar12 = " failed\n  ! mbedtls_net_connect returned %d\n\n";
      }
    }
    else {
      uVar13 = (ulong)uVar8;
      pcVar12 = " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n";
    }
    uVar8 = (uint)uVar13;
LAB_001109ca:
    printf(pcVar12,uVar13);
LAB_001109d1:
    mbedtls_ssl_free(&local_1118);
    mbedtls_ssl_config_free(&local_1290);
    goto LAB_00110898;
  }
  if (opt.mode != 1) goto LAB_00110885;
  crt = &local_a40;
  mbedtls_x509_crt_init((mbedtls_x509_crt *)crt);
  printf("\n  . Loading the certificate(s) ...");
  fflush(_stdout);
  uVar8 = mbedtls_x509_crt_parse_file((mbedtls_x509_crt *)crt,opt.filename);
  if ((int)uVar8 < 0) {
    pcVar12 = " failed\n  !  mbedtls_x509_crt_parse_file returned %d\n\n";
LAB_00110952:
    uVar13 = (ulong)uVar8;
LAB_00110954:
    printf(pcVar12,uVar13);
  }
  else {
    if ((uVar8 != 0) && (opt.permissive == 0)) {
      pcVar12 = " failed\n  !  mbedtls_x509_crt_parse failed to parse %d certificates\n\n";
      goto LAB_00110952;
    }
    puts(" ok");
    do {
      puts("  . Peer certificate information    ...");
      iVar7 = mbedtls_x509_crt_info(local_638,0x3ff,"      ",(mbedtls_x509_crt *)crt);
      if (iVar7 == -1) {
        pcVar12 = " failed\n  !  mbedtls_x509_crt_info returned %d\n\n";
        uVar8 = 0xffffffff;
        uVar13 = 0xffffffff;
        goto LAB_00110954;
      }
      puts(local_638);
      crt = *(mbedtls_entropy_context **)&crt->source[7].strong;
    } while (crt != (mbedtls_entropy_context *)0x0);
    if (bVar2) {
      uVar8 = 0;
      printf("  . Verifying X.509 certificate...");
      uVar9 = mbedtls_x509_crt_verify
                        ((mbedtls_x509_crt *)&local_a40,&local_e08,&local_be0,(char *)0x0,
                         &local_1294,my_verify,(void *)0x0);
      if (uVar9 == 0) {
        puts(" ok");
      }
      else {
        puts(" failed");
        mbedtls_x509_crt_verify_info(local_238,0x200,"  ! ",local_1294);
        puts(local_238);
        uVar8 = uVar9;
      }
    }
    else {
      uVar8 = 0;
    }
  }
  mbedtls_x509_crt_free((mbedtls_x509_crt *)&local_a40);
LAB_00110898:
  mbedtls_net_free(&local_1298);
  mbedtls_x509_crt_free(&local_e08);
  mbedtls_x509_crl_free(&local_be0);
  mbedtls_ctr_drbg_free(&local_f60);
  mbedtls_entropy_free(&local_a40);
  uVar9 = 1;
  if (-1 < (int)uVar8) {
    uVar9 = uVar8;
  }
  return uVar9;
}

Assistant:

int main( int argc, char *argv[] )
{
    int ret = 0;
    mbedtls_net_context server_fd;
    unsigned char buf[1024];
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    mbedtls_ssl_context ssl;
    mbedtls_ssl_config conf;
    mbedtls_x509_crt cacert;
    mbedtls_x509_crl cacrl;
    int i, j;
    uint32_t flags;
    int verify = 0;
    char *p, *q;
    const char *pers = "cert_app";

    /*
     * Set to sane values
     */
    mbedtls_net_init( &server_fd );
    mbedtls_ctr_drbg_init( &ctr_drbg );
    mbedtls_ssl_init( &ssl );
    mbedtls_ssl_config_init( &conf );
    mbedtls_x509_crt_init( &cacert );
#if defined(MBEDTLS_X509_CRL_PARSE_C)
    mbedtls_x509_crl_init( &cacrl );
#else
    /* Zeroize structure as CRL parsing is not supported and we have to pass
       it to the verify function */
    memset( &cacrl, 0, sizeof(mbedtls_x509_crl) );
#endif

    if( argc == 0 )
    {
    usage:
        mbedtls_printf( USAGE );
        ret = 2;
        goto exit;
    }

    opt.mode                = DFL_MODE;
    opt.filename            = DFL_FILENAME;
    opt.ca_file             = DFL_CA_FILE;
    opt.crl_file            = DFL_CRL_FILE;
    opt.ca_path             = DFL_CA_PATH;
    opt.server_name         = DFL_SERVER_NAME;
    opt.server_port         = DFL_SERVER_PORT;
    opt.debug_level         = DFL_DEBUG_LEVEL;
    opt.permissive          = DFL_PERMISSIVE;

    for( i = 1; i < argc; i++ )
    {
        p = argv[i];
        if( ( q = strchr( p, '=' ) ) == NULL )
            goto usage;
        *q++ = '\0';

        for( j = 0; p + j < q; j++ )
        {
            if( argv[i][j] >= 'A' && argv[i][j] <= 'Z' )
                argv[i][j] |= 0x20;
        }

        if( strcmp( p, "mode" ) == 0 )
        {
            if( strcmp( q, "file" ) == 0 )
                opt.mode = MODE_FILE;
            else if( strcmp( q, "ssl" ) == 0 )
                opt.mode = MODE_SSL;
            else
                goto usage;
        }
        else if( strcmp( p, "filename" ) == 0 )
            opt.filename = q;
        else if( strcmp( p, "ca_file" ) == 0 )
            opt.ca_file = q;
        else if( strcmp( p, "crl_file" ) == 0 )
            opt.crl_file = q;
        else if( strcmp( p, "ca_path" ) == 0 )
            opt.ca_path = q;
        else if( strcmp( p, "server_name" ) == 0 )
            opt.server_name = q;
        else if( strcmp( p, "server_port" ) == 0 )
            opt.server_port = q;
        else if( strcmp( p, "debug_level" ) == 0 )
        {
            opt.debug_level = atoi( q );
            if( opt.debug_level < 0 || opt.debug_level > 65535 )
                goto usage;
        }
        else if( strcmp( p, "permissive" ) == 0 )
        {
            opt.permissive = atoi( q );
            if( opt.permissive < 0 || opt.permissive > 1 )
                goto usage;
        }
        else
            goto usage;
    }

    /*
     * 1.1. Load the trusted CA
     */
    mbedtls_printf( "  . Loading the CA root certificate ..." );
    fflush( stdout );

    if( strlen( opt.ca_path ) )
    {
        ret = mbedtls_x509_crt_parse_path( &cacert, opt.ca_path );
        verify = 1;
    }
    else if( strlen( opt.ca_file ) )
    {
        ret = mbedtls_x509_crt_parse_file( &cacert, opt.ca_file );
        verify = 1;
    }

    if( ret < 0 )
    {
        mbedtls_printf( " failed\n  !  mbedtls_x509_crt_parse returned -0x%x\n\n", -ret );
        goto exit;
    }

    mbedtls_printf( " ok (%d skipped)\n", ret );

#if defined(MBEDTLS_X509_CRL_PARSE_C)
    if( strlen( opt.crl_file ) )
    {
        if( ( ret = mbedtls_x509_crl_parse_file( &cacrl, opt.crl_file ) ) != 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_x509_crl_parse returned -0x%x\n\n", -ret );
            goto exit;
        }

        verify = 1;
    }
#endif

    if( opt.mode == MODE_FILE )
    {
        mbedtls_x509_crt crt;
        mbedtls_x509_crt *cur = &crt;
        mbedtls_x509_crt_init( &crt );

        /*
         * 1.1. Load the certificate(s)
         */
        mbedtls_printf( "\n  . Loading the certificate(s) ..." );
        fflush( stdout );

        ret = mbedtls_x509_crt_parse_file( &crt, opt.filename );

        if( ret < 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_x509_crt_parse_file returned %d\n\n", ret );
            mbedtls_x509_crt_free( &crt );
            goto exit;
        }

        if( opt.permissive == 0 && ret > 0 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_x509_crt_parse failed to parse %d certificates\n\n", ret );
            mbedtls_x509_crt_free( &crt );
            goto exit;
        }

        mbedtls_printf( " ok\n" );

        /*
         * 1.2 Print the certificate(s)
         */
        while( cur != NULL )
        {
            mbedtls_printf( "  . Peer certificate information    ...\n" );
            ret = mbedtls_x509_crt_info( (char *) buf, sizeof( buf ) - 1, "      ",
                                 cur );
            if( ret == -1 )
            {
                mbedtls_printf( " failed\n  !  mbedtls_x509_crt_info returned %d\n\n", ret );
                mbedtls_x509_crt_free( &crt );
                goto exit;
            }

            mbedtls_printf( "%s\n", buf );

            cur = cur->next;
        }

        ret = 0;

        /*
         * 1.3 Verify the certificate
         */
        if( verify )
        {
            mbedtls_printf( "  . Verifying X.509 certificate..." );

            if( ( ret = mbedtls_x509_crt_verify( &crt, &cacert, &cacrl, NULL, &flags,
                                         my_verify, NULL ) ) != 0 )
            {
                char vrfy_buf[512];

                mbedtls_printf( " failed\n" );

                mbedtls_x509_crt_verify_info( vrfy_buf, sizeof( vrfy_buf ), "  ! ", flags );

                mbedtls_printf( "%s\n", vrfy_buf );
            }
            else
                mbedtls_printf( " ok\n" );
        }

        mbedtls_x509_crt_free( &crt );
    }
    else if( opt.mode == MODE_SSL )
    {
        /*
         * 1. Initialize the RNG and the session data
         */
        mbedtls_printf( "\n  . Seeding the random number generator..." );
        fflush( stdout );

        mbedtls_entropy_init( &entropy );
        if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func, &entropy,
                                   (const unsigned char *) pers,
                                   strlen( pers ) ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned %d\n", ret );
            goto ssl_exit;
        }

        mbedtls_printf( " ok\n" );

#if defined(MBEDTLS_DEBUG_C)
        mbedtls_debug_set_threshold( opt.debug_level );
#endif

        /*
         * 2. Start the connection
         */
        mbedtls_printf( "  . SSL connection to tcp/%s/%s...", opt.server_name,
                                                              opt.server_port );
        fflush( stdout );

        if( ( ret = mbedtls_net_connect( &server_fd, opt.server_name,
                                 opt.server_port, MBEDTLS_NET_PROTO_TCP ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_net_connect returned %d\n\n", ret );
            goto ssl_exit;
        }

        /*
         * 3. Setup stuff
         */
        if( ( ret = mbedtls_ssl_config_defaults( &conf,
                        MBEDTLS_SSL_IS_CLIENT,
                        MBEDTLS_SSL_TRANSPORT_STREAM,
                        MBEDTLS_SSL_PRESET_DEFAULT ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_config_defaults returned %d\n\n", ret );
            goto exit;
        }

        if( verify )
        {
            mbedtls_ssl_conf_authmode( &conf, MBEDTLS_SSL_VERIFY_REQUIRED );
            mbedtls_ssl_conf_ca_chain( &conf, &cacert, NULL );
            mbedtls_ssl_conf_verify( &conf, my_verify, NULL );
        }
        else
            mbedtls_ssl_conf_authmode( &conf, MBEDTLS_SSL_VERIFY_NONE );

        mbedtls_ssl_conf_rng( &conf, mbedtls_ctr_drbg_random, &ctr_drbg );
        mbedtls_ssl_conf_dbg( &conf, my_debug, stdout );

        if( ( ret = mbedtls_ssl_setup( &ssl, &conf ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_setup returned %d\n\n", ret );
            goto ssl_exit;
        }

        if( ( ret = mbedtls_ssl_set_hostname( &ssl, opt.server_name ) ) != 0 )
        {
            mbedtls_printf( " failed\n  ! mbedtls_ssl_set_hostname returned %d\n\n", ret );
            goto ssl_exit;
        }

        mbedtls_ssl_set_bio( &ssl, &server_fd, mbedtls_net_send, mbedtls_net_recv, NULL );

        /*
         * 4. Handshake
         */
        while( ( ret = mbedtls_ssl_handshake( &ssl ) ) != 0 )
        {
            if( ret != MBEDTLS_ERR_SSL_WANT_READ && ret != MBEDTLS_ERR_SSL_WANT_WRITE )
            {
                mbedtls_printf( " failed\n  ! mbedtls_ssl_handshake returned %d\n\n", ret );
                goto ssl_exit;
            }
        }

        mbedtls_printf( " ok\n" );

        /*
         * 5. Print the certificate
         */
        mbedtls_printf( "  . Peer certificate information    ...\n" );
        ret = mbedtls_x509_crt_info( (char *) buf, sizeof( buf ) - 1, "      ",
                             ssl.session->peer_cert );
        if( ret == -1 )
        {
            mbedtls_printf( " failed\n  !  mbedtls_x509_crt_info returned %d\n\n", ret );
            goto ssl_exit;
        }

        mbedtls_printf( "%s\n", buf );

        mbedtls_ssl_close_notify( &ssl );

ssl_exit:
        mbedtls_ssl_free( &ssl );
        mbedtls_ssl_config_free( &conf );
    }
    else
        goto usage;

exit:

    mbedtls_net_free( &server_fd );
    mbedtls_x509_crt_free( &cacert );
#if defined(MBEDTLS_X509_CRL_PARSE_C)
    mbedtls_x509_crl_free( &cacrl );
#endif
    mbedtls_ctr_drbg_free( &ctr_drbg );
    mbedtls_entropy_free( &entropy );

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    if( ret < 0 )
        ret = 1;

    return( ret );
}